

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

void * __thiscall
Lib::
SkipList<Inferences::ALASCA::SuperpositionConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::LDComparator>
::insertPositionRaw<Inferences::ALASCA::SuperpositionConf::Rhs>
          (SkipList<Inferences::ALASCA::SuperpositionConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::LDComparator>
           *this,Rhs *key)

{
  Node *pNVar1;
  bool bVar2;
  Node *pNVar3;
  Rhs *in_RSI;
  undefined8 *in_RDI;
  Node *next;
  Node *left;
  uint h;
  Node *newNode;
  uint nodeHeight;
  undefined4 in_stack_ffffffffffffffa8;
  Comparison in_stack_ffffffffffffffac;
  Node *local_38;
  uint local_2c;
  uint local_1c;
  
  local_1c = 0;
  while (bVar2 = Random::getBit(), bVar2) {
    local_1c = local_1c + 1;
  }
  if (*(uint *)(in_RDI + 1) <= local_1c) {
    if (*(uint *)(in_RDI + 1) < 0x20) {
      local_1c = *(uint *)(in_RDI + 1);
      *(int *)(in_RDI + 1) = *(int *)(in_RDI + 1) + 1;
    }
    else {
      local_1c = *(int *)(in_RDI + 1) - 1;
    }
  }
  pNVar3 = allocate((uint)((ulong)in_RSI >> 0x20));
  local_2c = *(int *)(in_RDI + 1) - 1;
  pNVar1 = (Node *)*in_RDI;
  do {
    while (local_38 = pNVar1, pNVar1 = local_38->nodes[local_2c], pNVar1 != (Node *)0x0) {
      in_stack_ffffffffffffffac =
           Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::LDComparator::
           compare<Inferences::ALASCA::SuperpositionConf::Rhs>
                     (in_RSI,(Rhs *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (in_stack_ffffffffffffffac == LESS) {
        if (local_2c <= local_1c) {
          pNVar3->nodes[local_2c] = pNVar1;
          local_38->nodes[local_2c] = pNVar3;
          if (local_2c == 0) {
            return pNVar3;
          }
        }
        local_2c = local_2c - 1;
        pNVar1 = local_38;
      }
      else if (1 < (uint)in_stack_ffffffffffffffac) {
        pNVar1 = local_38;
      }
    }
    if (local_2c <= local_1c) {
      local_38->nodes[local_2c] = pNVar3;
      pNVar3->nodes[local_2c] = (Node *)0x0;
      if (local_2c == 0) {
        return pNVar3;
      }
    }
    local_2c = local_2c - 1;
    pNVar1 = local_38;
  } while( true );
}

Assistant:

void* insertPositionRaw(Key key)
  {
    // select a random height between 0 and top
    unsigned nodeHeight = 0;
    while (Random::getBit()) {
      nodeHeight++;
    }
    if (nodeHeight >= _top) {
      if (_top < SKIP_LIST_MAX_HEIGHT) {
	nodeHeight = _top;
	_top++;
      }
      else {
	ASS(_top == SKIP_LIST_MAX_HEIGHT);
	nodeHeight = _top - 1;
      }
    }
    Node* newNode = allocate(nodeHeight);


    unsigned h = _top - 1;


    // left is a node with a value smaller than that of newNode and having
    // a large enough height.
    // this node is on the left of the inserted one
    Node* left = _left;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	if(h<=nodeHeight) {
	  left->nodes[h] = newNode;
	  newNode->nodes[h] = 0;
	  if (h == 0) {
	    return &newNode->value;
	  }
	}
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  // the node should be inserted on the left
	  if(h<=nodeHeight) {
	    newNode->nodes[h] = next;
	    left->nodes[h] = newNode;
	    if (h == 0) {
	      return &newNode->value;
	    }
	  }
	  h--;
	  break;

	case EQUAL: //we insert equal elements next to each other
	case GREATER:
	  left = next;
	  break;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }